

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

int AF_AActor_isTeammate
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  PClass *pPVar4;
  char *pcVar5;
  AActor *other;
  AActor *this;
  bool bVar6;
  PClass *pPVar3;
  undefined4 extraout_var_00;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_00431c35;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_00431c1c:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_00431c35:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1b0b,
                  "int AF_AActor_isTeammate(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  this = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (AActor *)0x0) goto LAB_00431b3b;
    pPVar3 = (this->super_DThinker).super_DObject.Class;
    if (pPVar3 == (PClass *)0x0) {
      iVar1 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      pPVar3 = (PClass *)CONCAT44(extraout_var,iVar1);
      (this->super_DThinker).super_DObject.Class = pPVar3;
    }
    bVar6 = pPVar3 != (PClass *)0x0;
    if (pPVar3 != pPVar4 && bVar6) {
      do {
        pPVar3 = pPVar3->ParentClass;
        bVar6 = pPVar3 != (PClass *)0x0;
        if (pPVar3 == pPVar4) break;
      } while (pPVar3 != (PClass *)0x0);
    }
    if (!bVar6) {
      pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_00431c35;
    }
  }
  else {
    if (this != (AActor *)0x0) goto LAB_00431c1c;
LAB_00431b3b:
    this = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_00431c5d;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_00431c25:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_00431c5d;
  }
  other = (AActor *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (other == (AActor *)0x0) goto LAB_00431b6e;
  }
  else {
    if (other != (AActor *)0x0) goto LAB_00431c25;
LAB_00431b6e:
    NullParam("\"other\"");
    other = (AActor *)param[1].field_0.field_1.a;
    if (other == (AActor *)0x0) {
      uVar2 = 0;
      goto LAB_00431be8;
    }
  }
  pPVar3 = AActor::RegistrationInfo.MyClass;
  pPVar4 = (other->super_DThinker).super_DObject.Class;
  if (pPVar4 == (PClass *)0x0) {
    iVar1 = (**(other->super_DThinker).super_DObject._vptr_DObject)(other);
    pPVar4 = (PClass *)CONCAT44(extraout_var_00,iVar1);
    (other->super_DThinker).super_DObject.Class = pPVar4;
  }
  bVar6 = pPVar4 != (PClass *)0x0;
  if (pPVar4 != pPVar3 && bVar6) {
    do {
      pPVar4 = pPVar4->ParentClass;
      bVar6 = pPVar4 != (PClass *)0x0;
      if (pPVar4 == pPVar3) break;
    } while (pPVar4 != (PClass *)0x0);
  }
  if (!bVar6) {
    pcVar5 = "other == NULL || other->IsKindOf(RUNTIME_CLASS(AActor))";
LAB_00431c5d:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1b0c,
                  "int AF_AActor_isTeammate(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar6 = AActor::IsTeammate(this,other);
  uVar2 = (uint)bVar6;
LAB_00431be8:
  if (numret < 1) {
    iVar1 = 0;
  }
  else {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1b0d,
                    "int AF_AActor_isTeammate(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    if (ret->RegType != '\0') {
      __assert_fail("RegType == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                    ,0x13f,"void VMReturn::SetInt(int)");
    }
    *(uint *)ret->Location = uVar2;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, isTeammate)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT_NOT_NULL(other, AActor);
	ACTION_RETURN_BOOL(self->IsTeammate(other));
}